

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintString
          (FastFieldValuePrinter *this,string *val,BaseTextGenerator *generator)

{
  long *local_30;
  undefined8 local_28;
  long local_20 [2];
  
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  if (val->_M_string_length != 0) {
    absl::lts_20240722::CEscape_abi_cxx11_(&local_30,val->_M_string_length,(val->_M_dataplus)._M_p);
    (*generator->_vptr_BaseTextGenerator[5])(generator,local_30,local_28);
    if (local_30 != local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
  }
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintString(
    const std::string& val, BaseTextGenerator* generator) const {
  generator->PrintLiteral("\"");
  if (!val.empty()) {
    generator->PrintString(absl::CEscape(val));
  }
  generator->PrintLiteral("\"");
}